

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_skill.cpp
# Opt level: O1

FSkillInfo * __thiscall FSkillInfo::operator=(FSkillInfo *this,FSkillInfo *other)

{
  (this->Name).Index = (other->Name).Index;
  this->AmmoFactor = other->AmmoFactor;
  this->DoubleAmmoFactor = other->DoubleAmmoFactor;
  this->DropAmmoFactor = other->DropAmmoFactor;
  this->DamageFactor = other->DamageFactor;
  this->FastMonsters = other->FastMonsters;
  this->SlowMonsters = other->SlowMonsters;
  this->DisableCheats = other->DisableCheats;
  this->AutoUseHealth = other->AutoUseHealth;
  this->EasyBossBrain = other->EasyBossBrain;
  this->EasyKey = other->EasyKey;
  this->RespawnCounter = other->RespawnCounter;
  this->RespawnLimit = other->RespawnLimit;
  this->Aggressiveness = other->Aggressiveness;
  this->SpawnFilter = other->SpawnFilter;
  this->ACSReturn = other->ACSReturn;
  FString::operator=(&this->MenuName,&other->MenuName);
  FString::operator=(&this->PicName,&other->PicName);
  TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>::operator=
            (&this->MenuNamesForPlayerClass,&other->MenuNamesForPlayerClass);
  this->MustConfirm = other->MustConfirm;
  FString::operator=(&this->MustConfirmText,&other->MustConfirmText);
  this->Shortcut = other->Shortcut;
  FString::operator=(&this->TextColor,&other->TextColor);
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::operator=
            (&this->Replace,&other->Replace);
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::operator=
            (&this->Replaced,&other->Replaced);
  this->MonsterHealth = other->MonsterHealth;
  this->FriendlyHealth = other->FriendlyHealth;
  this->NoPain = other->NoPain;
  this->Infighting = other->Infighting;
  this->ArmorFactor = other->ArmorFactor;
  this->HealthFactor = other->HealthFactor;
  return this;
}

Assistant:

FSkillInfo &FSkillInfo::operator=(const FSkillInfo &other)
{
	Name = other.Name;
	AmmoFactor = other.AmmoFactor;
	DoubleAmmoFactor = other.DoubleAmmoFactor;
	DropAmmoFactor = other.DropAmmoFactor;
	DamageFactor = other.DamageFactor;
	FastMonsters = other.FastMonsters;
	SlowMonsters = other.SlowMonsters;
	DisableCheats = other.DisableCheats;
	AutoUseHealth = other.AutoUseHealth;
	EasyBossBrain = other.EasyBossBrain;
	EasyKey = other.EasyKey;
	RespawnCounter= other.RespawnCounter;
	RespawnLimit= other.RespawnLimit;
	Aggressiveness= other.Aggressiveness;
	SpawnFilter = other.SpawnFilter;
	ACSReturn = other.ACSReturn;
	MenuName = other.MenuName;
	PicName = other.PicName;
	MenuNamesForPlayerClass = other.MenuNamesForPlayerClass;
	MustConfirm = other.MustConfirm;
	MustConfirmText = other.MustConfirmText;
	Shortcut = other.Shortcut;
	TextColor = other.TextColor;
	Replace = other.Replace;
	Replaced = other.Replaced;
	MonsterHealth = other.MonsterHealth;
	FriendlyHealth = other.FriendlyHealth;
	NoPain = other.NoPain;
	Infighting = other.Infighting;
	ArmorFactor = other.ArmorFactor;
	HealthFactor = other.HealthFactor;
	return *this;
}